

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Identifier __thiscall
soul::StructuralParser::parseIdentifierWithMaxLength(StructuralParser *this,size_t maxLength)

{
  bool bVar1;
  Identifier IVar2;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3337);
  if (bVar1) {
    checkLength(this,&(this->super_SOULTokeniser).currentStringValue,maxLength);
  }
  IVar2 = parseIdentifier(this);
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseIdentifierWithMaxLength (size_t maxLength)
    {
        if (matches (Token::identifier))
            checkLength (currentStringValue, maxLength);

        return parseIdentifier();
    }